

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  char *pcVar1;
  char *__s;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  
  pcVar4 = (this->pathname_)._M_dataplus._M_p;
  pcVar1 = (char *)(this->pathname_)._M_string_length;
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,0x12fa61);
    return;
  }
  __s = (char *)operator_new__((ulong)(pcVar1 + 1));
  memset(__s,0,(size_t)(pcVar1 + 1));
  cVar3 = *pcVar4;
  pcVar2 = __s;
  while (cVar3 != '\0') {
    *pcVar2 = cVar3;
    if (*pcVar4 == '/') {
      do {
        cVar3 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      } while (cVar3 == '/');
    }
    else {
      cVar3 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
    }
    pcVar2 = pcVar2 + 1;
  }
  *pcVar2 = '\0';
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)__s);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
    return;
  }
  return;
}

Assistant:

void FilePath::Normalize() {
  if (pathname_.c_str() == NULL) {
    pathname_ = "";
    return;
  }
  const char* src = pathname_.c_str();
  char* const dest = new char[pathname_.length() + 1];
  char* dest_ptr = dest;
  memset(dest_ptr, 0, pathname_.length() + 1);

  while (*src != '\0') {
    *dest_ptr = *src;
    if (!IsPathSeparator(*src)) {
      src++;
    } else {
#if GTEST_HAS_ALT_PATH_SEP_
      if (*dest_ptr == kAlternatePathSeparator) {
        *dest_ptr = kPathSeparator;
      }
#endif
      while (IsPathSeparator(*src))
        src++;
    }
    dest_ptr++;
  }
  *dest_ptr = '\0';
  pathname_ = dest;
  delete[] dest;
}